

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int numBytes)

{
  ostream *poVar1;
  string *psVar2;
  int precision;
  uint uVar3;
  ostringstream buf;
  string local_1a8;
  undefined1 local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  uVar3 = (uint)this;
  if ((int)uVar3 < 0x400) {
    poVar1 = (ostream *)std::ostream::operator<<(local_188,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," byte(s)",8);
  }
  else {
    if (uVar3 < 0x100000) {
      de::floatToString_abi_cxx11_
                (&local_1a8,(de *)&DAT_00000001,(float)(int)uVar3 * 0.0009765625,precision);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," KiB",4);
    }
    else {
      de::floatToString_abi_cxx11_
                (&local_1a8,(de *)&DAT_00000001,(float)(int)uVar3 * 0.0009765625 * 0.0009765625,
                 precision);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," MiB",4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return psVar2;
}

Assistant:

static std::string getHumanReadableByteSize (int numBytes)
{
	std::ostringstream buf;

	if (numBytes < 1024)
		buf << numBytes << " byte(s)";
	else if (numBytes < 1024 * 1024)
		buf << de::floatToString((float)numBytes/1024.0f, 1) << " KiB";
	else
		buf << de::floatToString((float)numBytes/1024.0f/1024.0f, 1) << " MiB";

	return buf.str();
}